

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb-compat-util.h
# Opt level: O2

char * mmdb_strndup(char *str,size_t n)

{
  size_t len;
  size_t sVar1;
  char *__dest;
  size_t __n;
  
  for (sVar1 = 0; (__n = n, n != sVar1 && (__n = sVar1, str[sVar1] != '\0')); sVar1 = sVar1 + 1) {
  }
  __dest = (char *)malloc(__n + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,str,__n);
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

static char *mmdb_strndup(const char *str, size_t n) {
    size_t len;
    char *copy;

    len = mmdb_strnlen(str, n);
    if ((copy = malloc(len + 1)) == NULL)
        return (NULL);
    memcpy(copy, str, len);
    copy[len] = '\0';
    return (copy);
}